

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32_stage9_sse4_1
               (__m128i *bf1,__m128i *out,int do_cols,int bd,int out_shift,__m128i *clamp_lo,
               __m128i *clamp_hi)

{
  int in_ECX;
  int in_EDX;
  __m128i *in_RSI;
  __m128i *in_R8;
  __m128i *in_R9;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in0_11;
  __m128i in0_12;
  __m128i in0_13;
  __m128i in0_14;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in1_11;
  __m128i in1_12;
  __m128i in1_13;
  __m128i in1_14;
  longlong in_stack_00000008;
  int i;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar1;
  longlong local_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  int local_7c;
  __m128i *local_78;
  int local_6c;
  int local_68;
  int local_64;
  __m128i *local_60;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  longlong local_28;
  longlong lStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_6c = (int)in_R8;
  in0[1] = in_RSI + 0x1f;
  in0[0] = (longlong)in_RSI;
  in1[1] = in_stack_00000008;
  in1[0] = (longlong)in_R9;
  local_78 = in_R9;
  local_68 = in_ECX;
  local_64 = in_EDX;
  local_60 = in_RSI;
  addsub_sse4_1(in0,in1,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_00[0] = local_60 + 1;
  in0_00[1] = local_60 + 0x1e;
  in1_00[1] = in_stack_00000008;
  in1_00[0] = (longlong)local_78;
  addsub_sse4_1(in0_00,in1_00,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_01[0] = local_60 + 2;
  in0_01[1] = local_60 + 0x1d;
  in1_01[1] = in_stack_00000008;
  in1_01[0] = (longlong)local_78;
  addsub_sse4_1(in0_01,in1_01,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_02[0] = local_60 + 3;
  in0_02[1] = local_60 + 0x1c;
  in1_02[1] = in_stack_00000008;
  in1_02[0] = (longlong)local_78;
  addsub_sse4_1(in0_02,in1_02,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_03[0] = local_60 + 4;
  in0_03[1] = local_60 + 0x1b;
  in1_03[1] = in_stack_00000008;
  in1_03[0] = (longlong)local_78;
  addsub_sse4_1(in0_03,in1_03,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_04[0] = local_60 + 5;
  in0_04[1] = local_60 + 0x1a;
  in1_04[1] = in_stack_00000008;
  in1_04[0] = (longlong)local_78;
  addsub_sse4_1(in0_04,in1_04,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_05[0] = local_60 + 6;
  in0_05[1] = local_60 + 0x19;
  in1_05[1] = in_stack_00000008;
  in1_05[0] = (longlong)local_78;
  addsub_sse4_1(in0_05,in1_05,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_06[0] = local_60 + 7;
  in0_06[1] = local_60 + 0x18;
  in1_06[1] = in_stack_00000008;
  in1_06[0] = (longlong)local_78;
  addsub_sse4_1(in0_06,in1_06,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_07[0] = local_60 + 8;
  in0_07[1] = local_60 + 0x17;
  in1_07[1] = in_stack_00000008;
  in1_07[0] = (longlong)local_78;
  addsub_sse4_1(in0_07,in1_07,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_08[0] = local_60 + 9;
  in0_08[1] = local_60 + 0x16;
  in1_08[1] = in_stack_00000008;
  in1_08[0] = (longlong)local_78;
  addsub_sse4_1(in0_08,in1_08,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_09[0] = local_60 + 10;
  in0_09[1] = local_60 + 0x15;
  in1_09[1] = in_stack_00000008;
  in1_09[0] = (longlong)local_78;
  addsub_sse4_1(in0_09,in1_09,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_10[0] = local_60 + 0xb;
  in0_10[1] = local_60 + 0x14;
  in1_10[1] = in_stack_00000008;
  in1_10[0] = (longlong)local_78;
  addsub_sse4_1(in0_10,in1_10,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_11[0] = local_60 + 0xc;
  in0_11[1] = local_60 + 0x13;
  in1_11[1] = in_stack_00000008;
  in1_11[0] = (longlong)local_78;
  addsub_sse4_1(in0_11,in1_11,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_12[0] = local_60 + 0xd;
  in0_12[1] = local_60 + 0x12;
  in1_12[1] = in_stack_00000008;
  in1_12[0] = (longlong)local_78;
  addsub_sse4_1(in0_12,in1_12,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_13[0] = local_60 + 0xe;
  in0_13[1] = local_60 + 0x11;
  in1_13[1] = in_stack_00000008;
  in1_13[0] = (longlong)local_78;
  addsub_sse4_1(in0_13,in1_13,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  in0_14[0] = local_60 + 0xf;
  in0_14[1] = local_60 + 0x10;
  in1_14[1] = in_stack_00000008;
  in1_14[0] = (longlong)local_78;
  addsub_sse4_1(in0_14,in1_14,in_R8,in_R9,in_stack_ffffffffffffff48,
                (__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (local_64 == 0) {
    if (local_68 + 6 < 0x10) {
      local_7c = 0x10;
    }
    else {
      local_7c = local_68 + 6;
    }
    local_4c = -(1 << ((char)local_7c - 1U & 0x1f));
    local_98 = CONCAT44(local_4c,local_4c);
    lStack_90 = CONCAT44(local_4c,local_4c);
    local_50 = (1 << ((char)local_7c - 1U & 0x1f)) + -1;
    local_a8 = CONCAT44(local_50,local_50);
    lStack_a0 = CONCAT44(local_50,local_50);
    local_48 = local_98;
    lStack_40 = lStack_90;
    local_38 = local_4c;
    local_34 = local_4c;
    local_30 = local_4c;
    local_2c = local_4c;
    local_28 = local_a8;
    lStack_20 = lStack_a0;
    local_10 = local_50;
    local_c = local_50;
    local_8 = local_50;
    local_4 = local_50;
    for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 8) {
      round_shift_4x4(local_60 + iVar1,local_6c);
      round_shift_4x4(local_60 + (long)iVar1 + 4,local_6c);
    }
    highbd_clamp_epi32_sse4_1(local_60,local_60,(__m128i *)&local_98,(__m128i *)&local_a8,0x20);
  }
  return;
}

Assistant:

static inline void idct32_stage9_sse4_1(__m128i *bf1, __m128i *out,
                                        const int do_cols, const int bd,
                                        const int out_shift,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi) {
  addsub_sse4_1(bf1[0], bf1[31], out + 0, out + 31, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[30], out + 1, out + 30, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[29], out + 2, out + 29, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[28], out + 3, out + 28, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[4], bf1[27], out + 4, out + 27, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[5], bf1[26], out + 5, out + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[6], bf1[25], out + 6, out + 25, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[7], bf1[24], out + 7, out + 24, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[8], bf1[23], out + 8, out + 23, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[9], bf1[22], out + 9, out + 22, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[10], bf1[21], out + 10, out + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[11], bf1[20], out + 11, out + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[12], bf1[19], out + 12, out + 19, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[13], bf1[18], out + 13, out + 18, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[14], bf1[17], out + 14, out + 17, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[15], bf1[16], out + 15, out + 16, clamp_lo, clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    for (int i = 0; i < 32; i += 8) {
      round_shift_4x4(out + i, out_shift);
      round_shift_4x4(out + i + 4, out_shift);
    }
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}